

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_pool_1d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int s0,int p0)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  undefined4 in_EDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int32_t params [4];
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffff98;
  ggml_type in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  ggml_calc_pool_output_size(in_RSI->ne[0],in_ECX,in_R8D,(float)in_R9D);
  pgVar1 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(int64_t *)0x151171);
  ggml_set_op_params((ggml_tensor *)CONCAT44(in_R9D,in_R8D),(void *)CONCAT44(in_ECX,in_EDX),0x1511a7
                    );
  pgVar1->op = GGML_OP_POOL_1D;
  pgVar1->src[0] = in_RSI;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_pool_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   s0,
        int                   p0) {
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        a->ne[1],
        a->ne[2],
        a->ne[3],
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, s0, p0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_1D;
    result->src[0] = a;

    return result;
}